

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O0

void update_bw_palette_rgba(Emulator *e,PaletteType type)

{
  int local_20;
  int local_1c;
  int i_1;
  int pal;
  int i;
  PaletteType type_local;
  Emulator *e_local;
  
  for (i_1 = 0; i_1 < 4; i_1 = i_1 + 1) {
    e->pal[type].color[i_1] = e->color_to_rgba[type].color[(e->state).ppu.pal[type].color[i_1]];
  }
  if (type == PALETTE_TYPE_BGP) {
    for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
      for (local_20 = 0; local_20 < 4; local_20 = local_20 + 1) {
        e->sgb_pal[local_1c].color[local_20] =
             (e->state).sgb.screen_pal[local_1c].color[(e->state).ppu.pal[0].color[local_20]];
      }
    }
  }
  return;
}

Assistant:

static void update_bw_palette_rgba(Emulator* e, PaletteType type) {
  for (int i = 0; i < 4; ++i) {
    e->pal[type].color[i] =
        e->color_to_rgba[type].color[PPU.pal[type].color[i]];
  }
  if (type == PALETTE_TYPE_BGP) {
    for (int pal = 0; pal < 4; ++pal) {
      for (int i = 0; i < 4; ++i) {
        e->sgb_pal[pal].color[i] =
            SGB.screen_pal[pal].color[PPU.pal[PALETTE_TYPE_BGP].color[i]];
      }
    }
  }
}